

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void init_random_generator(int luma_line,uint16_t seed)

{
  int luma_num;
  uint16_t lsb;
  uint16_t msb;
  uint16_t seed_local;
  int luma_line_local;
  
  random_register =
       (seed & 0xff00) + (seed & 0xff) ^ (ushort)(((luma_line >> 5) * 0x25 + 0xb2U & 0xff) << 8) ^
       (short)(luma_line >> 5) * 0xad + 0x69U & 0xff;
  return;
}

Assistant:

static void init_random_generator(int luma_line, uint16_t seed) {
  // same for the picture

  uint16_t msb = (seed >> 8) & 255;
  uint16_t lsb = seed & 255;

  random_register = (msb << 8) + lsb;

  //  changes for each row
  int luma_num = luma_line >> 5;

  random_register ^= ((luma_num * 37 + 178) & 255) << 8;
  random_register ^= ((luma_num * 173 + 105) & 255);
}